

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

void duckdb::ArrowJson::PopulateSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *schema,LogicalType *type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  reference pvVar1;
  char *pcVar2;
  char *pcVar3;
  ClientProperties options;
  ArrowSchemaMetadata schema_metadata;
  string local_100;
  undefined1 local_e0 [128];
  ArrowSchemaMetadata local_60;
  
  ArrowExtensionMetadata::ArrowExtensionMetadata
            ((ArrowExtensionMetadata *)local_e0,&extension->extension_metadata);
  ::std::__cxx11::string::string((string *)&local_100,(string *)local_e0);
  ArrowSchemaMetadata::ArrowCanonicalType(&local_60,&local_100);
  ::std::__cxx11::string::~string((string *)&local_100);
  ArrowExtensionMetadata::~ArrowExtensionMetadata((ArrowExtensionMetadata *)local_e0);
  ArrowSchemaMetadata::SerializeMetadata((ArrowSchemaMetadata *)local_e0);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
              *)&root_holder->metadata_info,
             (unique_ptr<char[],_std::default_delete<char>,_false> *)local_e0);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)local_e0);
  pvVar1 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                     (&root_holder->metadata_info);
  schema->metadata =
       (pvVar1->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  ClientContext::GetClientProperties((ClientProperties *)local_e0,context);
  pcVar3 = "u";
  if (local_e0[0x20] == LARGE) {
    pcVar3 = "U";
  }
  pcVar2 = "vu";
  if (local_e0[0x22] == false) {
    pcVar2 = pcVar3;
  }
  schema->format = pcVar2;
  ::std::__cxx11::string::~string((string *)local_e0);
  ArrowSchemaMetadata::~ArrowSchemaMetadata(&local_60);
  return;
}

Assistant:

static void PopulateSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &schema, const LogicalType &type,
	                           ClientContext &context, const ArrowTypeExtension &extension) {
		const ArrowSchemaMetadata schema_metadata =
		    ArrowSchemaMetadata::ArrowCanonicalType(extension.GetInfo().GetExtensionName());
		root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
		schema.metadata = root_holder.metadata_info.back().get();
		const auto options = context.GetClientProperties();
		if (options.produce_arrow_string_view) {
			schema.format = "vu";
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				schema.format = "U";
			} else {
				schema.format = "u";
			}
		}
	}